

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void initMaterial(tinyobj_material_t *material)

{
  long lVar1;
  
  material->name = (char *)0x0;
  material->ambient_texname = (char *)0x0;
  material->diffuse_texname = (char *)0x0;
  material->specular_texname = (char *)0x0;
  material->specular_highlight_texname = (char *)0x0;
  material->bump_texname = (char *)0x0;
  material->displacement_texname = (char *)0x0;
  material->alpha_texname = (char *)0x0;
  for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)material->diffuse + lVar1) = 0;
    *(undefined4 *)((long)material->specular + lVar1) = 0;
    *(undefined4 *)((long)material->transmittance + lVar1) = 0;
    *(undefined4 *)((long)material->emission + lVar1) = 0;
    *(undefined4 *)((long)material->emission + lVar1 + 0xc) = 0;
  }
  material->dissolve = 1.0;
  material->illum = 0;
  material->shininess = 1.0;
  material->ior = 1.0;
  return;
}

Assistant:

static void initMaterial(tinyobj_material_t *material) {
  int i;
  material->name = NULL;
  material->ambient_texname = NULL;
  material->diffuse_texname = NULL;
  material->specular_texname = NULL;
  material->specular_highlight_texname = NULL;
  material->bump_texname = NULL;
  material->displacement_texname = NULL;
  material->alpha_texname = NULL;
  for (i = 0; i < 3; i++) {
    material->ambient[i] = 0.f;
    material->diffuse[i] = 0.f;
    material->specular[i] = 0.f;
    material->transmittance[i] = 0.f;
    material->emission[i] = 0.f;
  }
  material->illum = 0;
  material->dissolve = 1.f;
  material->shininess = 1.f;
  material->ior = 1.f;
}